

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseNewExpression
          (Parser *this,NameSyntax *newKeyword,
          bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  Token openParen_00;
  bool bVar1;
  ExpressionSyntax *pEVar2;
  ExpressionSyntax *expression;
  NameSyntax *pNVar3;
  SyntaxNode *pSVar4;
  ArgumentListSyntax *argList;
  Diagnostic *pDVar5;
  Token TVar6;
  Token closeBracket_00;
  SourceRange range;
  Token local_138;
  SourceLocation local_128;
  DiagCode local_11c;
  SourceRange local_118;
  Token local_108;
  SourceLocation local_f8;
  DiagCode local_f0;
  underlying_type_t<slang::parsing::detail::ExpressionOptions> local_ec;
  bitmask<slang::parsing::detail::ExpressionOptions> local_e8;
  bitmask<slang::parsing::detail::ExpressionOptions> local_e4;
  Token local_e0;
  ScopedNameSyntax *local_d0;
  ScopedNameSyntax *scoped;
  Token local_c0;
  undefined1 local_b0 [24];
  ExpressionSyntax *local_98;
  Info *local_90;
  ExpressionSyntax *local_88;
  ExpressionSyntax *initializerExpr;
  Token openParen;
  ParenthesizedExpressionSyntax *initializer;
  Token closeBracket;
  ExpressionSyntax *sizeExpr;
  Token openBracket;
  TokenKind kind;
  NameSyntax *newKeyword_local;
  Parser *this_local;
  NewArrayExpressionSyntax *pNStack_10;
  bitmask<slang::parsing::detail::ExpressionOptions> options_local;
  
  this_local._4_4_ = options.m_bits;
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  openBracket.info._0_2_ = TVar6.kind;
  if ((TokenKind)openBracket.info == OpenBracket) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    pEVar2 = parseExpression(this);
    closeBracket_00 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    openParen.info = (Info *)0x0;
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      _initializerExpr = ParserBase::consume(&this->super_ParserBase);
      expression = parseExpression(this);
      local_98 = initializerExpr;
      local_90 = (Info *)openParen._0_8_;
      local_88 = expression;
      local_b0._8_16_ =
           (undefined1  [16])ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      openParen_00.info = local_90;
      openParen_00._0_8_ = local_98;
      openParen.info =
           (Info *)slang::syntax::SyntaxFactory::parenthesizedExpression
                             (&this->factory,openParen_00,expression,(Token)local_b0._8_16_);
    }
    sizeExpr = TVar6._0_8_;
    local_c0.info = (Info *)sizeExpr;
    openBracket._0_8_ = TVar6.info;
    local_b0._0_2_ = openBracket.kind;
    local_b0[2] = openBracket._2_1_;
    local_b0[3] = openBracket.numFlags.raw;
    local_b0._4_4_ = openBracket.rawLen;
    initializer = closeBracket_00._0_8_;
    scoped = (ScopedNameSyntax *)initializer;
    closeBracket._0_8_ = closeBracket_00.info;
    local_c0.kind = closeBracket.kind;
    local_c0._2_1_ = closeBracket._2_1_;
    local_c0.numFlags.raw = closeBracket.numFlags.raw;
    local_c0.rawLen = closeBracket.rawLen;
    pNStack_10 = slang::syntax::SyntaxFactory::newArrayExpression
                           (&this->factory,newKeyword,TVar6,pEVar2,closeBracket_00,
                            (ParenthesizedExpressionSyntax *)openParen.info);
  }
  else {
    if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
      local_d0 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>
                           ((SyntaxNode *)newKeyword);
      pNVar3 = not_null<slang::syntax::NameSyntax_*>::operator->(&local_d0->right);
      bVar1 = false;
      if ((pNVar3->super_ExpressionSyntax).super_SyntaxNode.kind == ConstructorName) {
        pSVar4 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::operator->(&local_d0->left);
        local_e0 = slang::syntax::SyntaxNode::getLastToken(pSVar4);
        bVar1 = local_e0.kind == SuperKeyword;
      }
      if (bVar1) {
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_e8,AllowSuperNewCall);
        local_e4 = bitmask<slang::parsing::detail::ExpressionOptions>::operator&
                             ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                              ((long)&this_local + 4),&local_e8);
        local_ec = 0;
        bVar1 = slang::operator==(&local_e4,&local_ec);
        if (bVar1) {
          local_f0.subsystem = Parser;
          local_f0.code = 100;
          pSVar4 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::operator->(&local_d0->right)
          ;
          local_108 = slang::syntax::SyntaxNode::getFirstToken(pSVar4);
          local_f8 = Token::location(&local_108);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,local_f0,local_f8);
          local_118 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar5,local_118);
        }
      }
    }
    if ((TokenKind)openBracket.info == OpenParenthesis) {
      argList = parseArgumentList(this);
      pNStack_10 = (NewArrayExpressionSyntax *)
                   slang::syntax::SyntaxFactory::newClassExpression
                             (&this->factory,newKeyword,argList);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression((TokenKind)openBracket.info);
      if (bVar1) {
        if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind != ConstructorName) {
          local_11c.subsystem = Parser;
          local_11c.code = 0x84;
          local_138 = ParserBase::peek(&this->super_ParserBase);
          local_128 = Token::location(&local_138);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,local_11c,local_128);
          range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar5,range);
        }
        pEVar2 = parseExpression(this);
        pNStack_10 = (NewArrayExpressionSyntax *)
                     slang::syntax::SyntaxFactory::copyClassExpression
                               (&this->factory,newKeyword,pEVar2);
      }
      else {
        pNStack_10 = (NewArrayExpressionSyntax *)
                     slang::syntax::SyntaxFactory::newClassExpression
                               (&this->factory,newKeyword,(ArgumentListSyntax *)0x0);
      }
    }
  }
  return &pNStack_10->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseNewExpression(NameSyntax& newKeyword,
                                             bitmask<ExpressionOptions> options) {
    // If we see an open bracket, this is a dynamic array new expression.
    auto kind = peek().kind;
    if (kind == TokenKind::OpenBracket) {
        auto openBracket = consume();
        auto& sizeExpr = parseExpression();
        auto closeBracket = expect(TokenKind::CloseBracket);

        ParenthesizedExpressionSyntax* initializer = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& initializerExpr = parseExpression();
            initializer = &factory.parenthesizedExpression(openParen, initializerExpr,
                                                           expect(TokenKind::CloseParenthesis));
        }
        return factory.newArrayExpression(newKeyword, openBracket, sizeExpr, closeBracket,
                                          initializer);
    }

    // Enforce rules for super.new placement.
    if (newKeyword.kind == SyntaxKind::ScopedName) {
        auto& scoped = newKeyword.as<ScopedNameSyntax>();
        if (scoped.right->kind == SyntaxKind::ConstructorName &&
            scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            if ((options & ExpressionOptions::AllowSuperNewCall) == 0) {
                addDiag(diag::InvalidSuperNew, scoped.right->getFirstToken().location())
                    << newKeyword.sourceRange();
            }
        }
    }

    // Otherwise this is a new-class or copy-class expression.
    // new-class has an optional argument list, copy-class has a required expression.
    // An open paren here would be ambiguous between an arg list and a parenthesized
    // expression -- we resolve by always taking the arg list.
    if (kind == TokenKind::OpenParenthesis)
        return factory.newClassExpression(newKeyword, &parseArgumentList());

    if (isPossibleExpression(kind)) {
        if (newKeyword.kind != SyntaxKind::ConstructorName)
            addDiag(diag::ScopedClassCopy, peek().location()) << newKeyword.sourceRange();
        return factory.copyClassExpression(newKeyword, parseExpression());
    }

    return factory.newClassExpression(newKeyword, nullptr);
}